

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int new_socket(uv_tcp_t *handle,int domain,unsigned_long flags)

{
  int iVar1;
  int *piVar2;
  int err;
  int sockfd;
  socklen_t slen;
  sockaddr_storage saddr;
  unsigned_long flags_local;
  int domain_local;
  uv_tcp_t *handle_local;
  
  saddr.__ss_align = flags;
  handle_local._4_4_ = uv__socket(domain,1,0);
  if (-1 < handle_local._4_4_) {
    iVar1 = uv__stream_open((uv_stream_t *)handle,handle_local._4_4_,(int)saddr.__ss_align);
    if (iVar1 == 0) {
      if ((saddr.__ss_align & 0x2000) != 0) {
        err = 0x80;
        memset(&sockfd,0,0x80);
        iVar1 = getsockname((handle->io_watcher).fd,(sockaddr *)&sockfd,(socklen_t *)&err);
        if (iVar1 != 0) {
          uv__close(handle_local._4_4_);
          piVar2 = __errno_location();
          return -*piVar2;
        }
        iVar1 = bind((handle->io_watcher).fd,(sockaddr *)&sockfd,err);
        if (iVar1 != 0) {
          uv__close(handle_local._4_4_);
          piVar2 = __errno_location();
          return -*piVar2;
        }
      }
      handle_local._4_4_ = 0;
    }
    else {
      uv__close(handle_local._4_4_);
      handle_local._4_4_ = iVar1;
    }
  }
  return handle_local._4_4_;
}

Assistant:

static int new_socket(uv_tcp_t* handle, int domain, unsigned long flags) {
  struct sockaddr_storage saddr;
  socklen_t slen;
  int sockfd;
  int err;

  err = uv__socket(domain, SOCK_STREAM, 0);
  if (err < 0)
    return err;
  sockfd = err;

  err = uv__stream_open((uv_stream_t*) handle, sockfd, flags);
  if (err) {
    uv__close(sockfd);
    return err;
  }

  if (flags & UV_HANDLE_BOUND) {
    /* Bind this new socket to an arbitrary port */
    slen = sizeof(saddr);
    memset(&saddr, 0, sizeof(saddr));
    if (getsockname(uv__stream_fd(handle), (struct sockaddr*) &saddr, &slen)) {
      uv__close(sockfd);
      return UV__ERR(errno);
    }

    if (bind(uv__stream_fd(handle), (struct sockaddr*) &saddr, slen)) {
      uv__close(sockfd);
      return UV__ERR(errno);
    }
  }

  return 0;
}